

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

rf_mipmaps_image *
rf_load_dds_image_from_file_ez(rf_mipmaps_image *__return_storage_ptr__,char *file)

{
  rf_io_callbacks io;
  char *file_local;
  
  io.read_file_proc = rf_libc_load_file_into_buffer;
  io.user_data = (void *)SUB168(ZEXT816(0x11f280) << 0x40,0);
  io.file_size_proc = (_func_rf_int_void_ptr_char_ptr *)SUB168(ZEXT816(0x11f280) << 0x40,8);
  rf_load_dds_image_from_file
            (__return_storage_ptr__,file,(rf_allocator)(ZEXT816(0x11f1f0) << 0x40),
             (rf_allocator)(ZEXT816(0x11f1f0) << 0x40),io);
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_mipmaps_image rf_load_dds_image_from_file_ez(const char* file) { return rf_load_dds_image_from_file(file, RF_DEFAULT_ALLOCATOR, RF_DEFAULT_ALLOCATOR, RF_DEFAULT_IO); }